

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void sdf_tools::die(char *file,int line,char *pattern,...)

{
  char in_AL;
  runtime_error *this;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  __va_list_tag *in_XMM1_Qb;
  char *in_XMM2_Qa;
  va_list args;
  string errMsg;
  __va_list_tag *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  string local_78 [16];
  string local_38 [32];
  undefined8 local_18;
  uint local_c;
  undefined8 local_8;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff10 = in_XMM1_Qb;
    in_stack_ffffffffffffff18 = in_XMM2_Qa;
  }
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  utils::strprintf_abi_cxx11_((char *)local_38,"[sdf_tools] %s:%d:\n",in_RDI,(ulong)in_ESI);
  utils::vstrprintf_abi_cxx11_(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::__cxx11::string::operator+=(local_38,local_78);
  std::__cxx11::string::~string(local_78);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void die(const char *file, int line, const char* pattern, ...)
{
    std::string errMsg = utils::strprintf("[sdf_tools] %s:%d:\n", file, line);

    va_list args;
    va_start(args, pattern);
    errMsg += utils::vstrprintf(pattern, args);
    va_end(args);

    throw std::runtime_error(errMsg);
}